

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::SetUnreachable(TypeChecker *this)

{
  Result RVar1;
  Label *label;
  Label *local_10;
  
  RVar1 = GetLabel(this,0,&local_10);
  if (RVar1.enum_ != Error) {
    local_10->unreachable = true;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
              (&this->type_stack_,local_10->type_stack_limit);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result TypeChecker::SetUnreachable() {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  label->unreachable = true;
  ResetTypeStackToLabel(label);
  return Result::Ok;
}